

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

int xmlSchemaBuildContentModelForSubstGroup
              (xmlSchemaParserCtxtPtr pctxt,xmlSchemaParticlePtr particle,int counter,
              xmlAutomataStatePtr end)

{
  xmlSchemaTreeItemPtr_conflict data;
  xmlAutomataStatePtr from;
  xmlHashTablePtr table;
  void *pvVar1;
  xmlAutomataPtr pxVar2;
  void *pvVar3;
  xmlAutomataStatePtr pxVar4;
  xmlNodePtr node;
  xmlAutomataStatePtr pxVar5;
  long *plVar6;
  int iVar7;
  int min;
  long lVar8;
  bool bVar9;
  
  data = particle->children;
  from = pctxt->state;
  if (end == (xmlAutomataStatePtr)0x0) {
    end = xmlAutomataNewState(pctxt->am);
  }
  table = pctxt->constructor->substGroups;
  if (table == (xmlHashTablePtr)0x0) {
    pvVar3 = (void *)0x0;
  }
  else {
    pvVar3 = xmlHashLookup2(table,(xmlChar *)data->next,*(xmlChar **)(data + 3));
  }
  if (pvVar3 == (void *)0x0) {
    node = xmlSchemaGetComponentNode((xmlSchemaBasicItemPtr)particle);
    xmlSchemaPErr(pctxt,node,0xbfd,
                  "Internal error: xmlSchemaBuildContentModelForSubstGroup, declaration is marked having a subst. group but none available.\n"
                  ,(xmlChar *)data->next,(xmlChar *)0x0);
    return 0;
  }
  if (counter < 0) {
    iVar7 = particle->maxOccurs;
    if (iVar7 != 0x40000000) {
      if (iVar7 == 1) {
        pxVar2 = pctxt->am;
        pxVar4 = xmlAutomataNewTransition2
                           (pxVar2,from,(xmlAutomataStatePtr)0x0,(xmlChar *)data->next,
                            *(xmlChar **)(data + 3),data);
        xmlAutomataNewEpsilon(pxVar2,pxVar4,end);
        plVar6 = *(long **)((long)pvVar3 + 8);
        if (0 < (int)plVar6[1]) {
          lVar8 = 0;
          do {
            pvVar1 = *(void **)(*plVar6 + lVar8 * 8);
            pxVar4 = xmlAutomataNewTransition2
                               (pctxt->am,from,(xmlAutomataStatePtr)0x0,
                                *(xmlChar **)((long)pvVar1 + 0x10),
                                *(xmlChar **)((long)pvVar1 + 0x60),pvVar1);
            xmlAutomataNewEpsilon(pctxt->am,pxVar4,end);
            lVar8 = lVar8 + 1;
            plVar6 = *(long **)((long)pvVar3 + 8);
          } while (lVar8 < (int)plVar6[1]);
        }
        goto LAB_001c9d62;
      }
      iVar7 = iVar7 + -1;
    }
    min = particle->minOccurs + -1;
    if (particle->minOccurs < 1) {
      min = 0;
    }
    iVar7 = xmlAutomataNewCounter(pctxt->am,min,iVar7);
    pxVar4 = xmlAutomataNewState(pctxt->am);
    pxVar2 = pctxt->am;
    pxVar5 = xmlAutomataNewTransition2
                       (pxVar2,from,(xmlAutomataStatePtr)0x0,(xmlChar *)data->next,
                        *(xmlChar **)(data + 3),data);
    xmlAutomataNewEpsilon(pxVar2,pxVar5,pxVar4);
    plVar6 = *(long **)((long)pvVar3 + 8);
    if (0 < (int)plVar6[1]) {
      lVar8 = 0;
      do {
        pvVar1 = *(void **)(*plVar6 + lVar8 * 8);
        pxVar2 = pctxt->am;
        pxVar5 = xmlAutomataNewTransition2
                           (pxVar2,from,(xmlAutomataStatePtr)0x0,*(xmlChar **)((long)pvVar1 + 0x10),
                            *(xmlChar **)((long)pvVar1 + 0x60),pvVar1);
        xmlAutomataNewEpsilon(pxVar2,pxVar5,pxVar4);
        lVar8 = lVar8 + 1;
        plVar6 = *(long **)((long)pvVar3 + 8);
      } while (lVar8 < (int)plVar6[1]);
    }
    xmlAutomataNewCountedTrans(pctxt->am,pxVar4,from,iVar7);
    xmlAutomataNewCounterTrans(pctxt->am,pxVar4,end,iVar7);
  }
  else {
    pxVar4 = xmlAutomataNewCountedTrans(pctxt->am,from,(xmlAutomataStatePtr)0x0,counter);
    xmlAutomataNewTransition2
              (pctxt->am,pxVar4,end,(xmlChar *)data->next,*(xmlChar **)(data + 3),data);
    plVar6 = *(long **)((long)pvVar3 + 8);
    if (0 < (int)plVar6[1]) {
      lVar8 = 0;
      do {
        pvVar1 = *(void **)(*plVar6 + lVar8 * 8);
        xmlAutomataNewTransition2
                  (pctxt->am,pxVar4,end,*(xmlChar **)((long)pvVar1 + 0x10),
                   *(xmlChar **)((long)pvVar1 + 0x60),pvVar1);
        lVar8 = lVar8 + 1;
        plVar6 = *(long **)((long)pvVar3 + 8);
      } while (lVar8 < (int)plVar6[1]);
    }
  }
LAB_001c9d62:
  bVar9 = particle->minOccurs == 0;
  if (bVar9) {
    xmlAutomataNewEpsilon(pctxt->am,from,end);
  }
  pctxt->state = end;
  return (uint)bVar9;
}

Assistant:

static int
xmlSchemaBuildContentModelForSubstGroup(xmlSchemaParserCtxtPtr pctxt,
	xmlSchemaParticlePtr particle, int counter, xmlAutomataStatePtr end)
{
    xmlAutomataStatePtr start, tmp;
    xmlSchemaElementPtr elemDecl, member;
    xmlSchemaSubstGroupPtr substGroup;
    int i;
    int ret = 0;

    elemDecl = (xmlSchemaElementPtr) particle->children;
    /*
    * Wrap the substitution group with a CHOICE.
    */
    start = pctxt->state;
    if (end == NULL)
	end = xmlAutomataNewState(pctxt->am);
    substGroup = xmlSchemaSubstGroupGet(pctxt, elemDecl);
    if (substGroup == NULL) {
	xmlSchemaPErr(pctxt, WXS_ITEM_NODE(particle),
	    XML_SCHEMAP_INTERNAL,
	    "Internal error: xmlSchemaBuildContentModelForSubstGroup, "
	    "declaration is marked having a subst. group but none "
	    "available.\n", elemDecl->name, NULL);
	return(0);
    }
    if (counter >= 0) {
	/*
	* NOTE that we put the declaration in, even if it's abstract.
	* However, an error will be raised during *validation* if an element
	* information item shall be validated against an abstract element
	* declaration.
	*/
	tmp = xmlAutomataNewCountedTrans(pctxt->am, start, NULL, counter);
        xmlAutomataNewTransition2(pctxt->am, tmp, end,
	            elemDecl->name, elemDecl->targetNamespace, elemDecl);
	/*
	* Add subst. group members.
	*/
	for (i = 0; i < substGroup->members->nbItems; i++) {
	    member = (xmlSchemaElementPtr) substGroup->members->items[i];
            xmlAutomataNewTransition2(pctxt->am, tmp, end,
		               member->name, member->targetNamespace, member);
	}
    } else if (particle->maxOccurs == 1) {
	/*
	* NOTE that we put the declaration in, even if it's abstract,
	*/
	xmlAutomataNewEpsilon(pctxt->am,
	    xmlAutomataNewTransition2(pctxt->am,
	    start, NULL,
	    elemDecl->name, elemDecl->targetNamespace, elemDecl), end);
	/*
	* Add subst. group members.
	*/
	for (i = 0; i < substGroup->members->nbItems; i++) {
	    member = (xmlSchemaElementPtr) substGroup->members->items[i];
	    /*
	    * NOTE: This fixes bug #341150. xmlAutomataNewOnceTrans2()
	    *  was incorrectly used instead of xmlAutomataNewTransition2()
	    *  (seems like a copy&paste bug from the XML_SCHEMA_TYPE_ALL
	    *  section in xmlSchemaBuildAContentModel() ).
	    * TODO: Check if xmlAutomataNewOnceTrans2() was instead
	    *  intended for the above "counter" section originally. I.e.,
	    *  check xs:all with subst-groups.
	    *
	    * tmp = xmlAutomataNewOnceTrans2(pctxt->am, start, NULL,
	    *	               member->name, member->targetNamespace,
	    *		       1, 1, member);
	    */
	    tmp = xmlAutomataNewTransition2(pctxt->am, start, NULL,
		member->name, member->targetNamespace, member);
	    xmlAutomataNewEpsilon(pctxt->am, tmp, end);
	}
    } else {
	xmlAutomataStatePtr hop;
	int maxOccurs = particle->maxOccurs == UNBOUNDED ?
	    UNBOUNDED : particle->maxOccurs - 1;
	int minOccurs = particle->minOccurs < 1 ? 0 : particle->minOccurs - 1;

	counter =
	    xmlAutomataNewCounter(pctxt->am, minOccurs,
	    maxOccurs);
	hop = xmlAutomataNewState(pctxt->am);

	xmlAutomataNewEpsilon(pctxt->am,
	    xmlAutomataNewTransition2(pctxt->am,
	    start, NULL,
	    elemDecl->name, elemDecl->targetNamespace, elemDecl),
	    hop);
	/*
	 * Add subst. group members.
	 */
	for (i = 0; i < substGroup->members->nbItems; i++) {
	    member = (xmlSchemaElementPtr) substGroup->members->items[i];
	    xmlAutomataNewEpsilon(pctxt->am,
		xmlAutomataNewTransition2(pctxt->am,
		start, NULL,
		member->name, member->targetNamespace, member),
		hop);
	}
	xmlAutomataNewCountedTrans(pctxt->am, hop, start, counter);
	xmlAutomataNewCounterTrans(pctxt->am, hop, end, counter);
    }
    if (particle->minOccurs == 0) {
	xmlAutomataNewEpsilon(pctxt->am, start, end);
        ret = 1;
    }
    pctxt->state = end;
    return(ret);
}